

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void * kj::_::castToConstVoid<kj::(anonymous_namespace)::MultipleDerivedDynamic>
                 (MultipleDerivedDynamic *ptr)

{
  _func_int *local_28;
  MultipleDerivedDynamic *cptr;
  MultipleDerivedDynamic *ptr_local;
  
  if (ptr == (MultipleDerivedDynamic *)0x0) {
    local_28 = (_func_int *)0x0;
  }
  else {
    local_28 = (_func_int *)
               ((long)&(ptr->super_DynamicType1)._vptr_DynamicType1 +
               (long)(ptr->super_DynamicType1)._vptr_DynamicType1[-2]);
  }
  return local_28;
}

Assistant:

const void* castToConstVoid(T* ptr) {
  if constexpr (_kj_internal_isPolymorphic((T*)nullptr)) {
    const T* cptr = ptr;
    return dynamic_cast<const void*>(cptr);
  } else {
    const T* cptr = ptr;
    return static_cast<const void*>(cptr);
  }
}